

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark
          (AutoSetupRecyclerForNonCollectingMark *this)

{
  Recycler *pRVar1;
  ObservableValueObserver<Memory::CollectionState> *pOVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  CollectionState local_1c;
  
  if (this->m_setupDone == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f27,"(m_setupDone)","m_setupDone");
    if (!bVar4) goto LAB_00722009;
    *puVar5 = 0;
  }
  if (this->m_recycler->allowAllocationDuringHeapEnum == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f28,"(!m_recycler.allowAllocationDuringHeapEnum)",
                       "!m_recycler.allowAllocationDuringHeapEnum");
    if (!bVar4) {
LAB_00722009:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  memcpy(&this->m_recycler->collectionStats,&this->m_previousCollectionStats,0x538);
  pRVar1 = this->m_recycler;
  local_1c = this->m_previousCollectionState;
  pOVar2 = (pRVar1->collectionState).observer;
  if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((pRVar1->collectionState).value != local_1c)) {
    (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,&local_1c,&pRVar1->collectionState);
  }
  (pRVar1->collectionState).value = local_1c;
  pRVar1 = this->m_recycler;
  pRVar1->isHeapEnumInProgress = false;
  pRVar1->isCollectionDisabled = false;
  return;
}

Assistant:

Recycler::AutoSetupRecyclerForNonCollectingMark::~AutoSetupRecyclerForNonCollectingMark()
{
    Assert(m_setupDone);
    Assert(!m_recycler.allowAllocationDuringHeapEnum);
#ifdef RECYCLER_STATS
    m_recycler.collectionStats = m_previousCollectionStats;
#endif
    m_recycler.SetCollectionState(m_previousCollectionState);
    m_recycler.isHeapEnumInProgress = false;
    m_recycler.isCollectionDisabled = false;
}